

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.hpp
# Opt level: O0

bool __thiscall
unodb::
db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
::remove_internal(db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                  *this,art_key_type k)

{
  basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> shifted_key;
  art_key_type k_00;
  bool bVar1;
  node_type nVar2;
  byte bVar3;
  uint uVar4;
  basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>
  *this_00;
  basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
  *this_01;
  key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
  *this_02;
  basic_node_ptr<unodb::detail::node_header> **ppbVar5;
  optional<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*> oVar6;
  basic_node_ptr<unodb::detail::node_header> *child_ptr;
  _Storage<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true> local_b0;
  optional<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*> remove_result;
  uint shared_prefix_len;
  key_prefix_size key_prefix_length;
  key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
  *key_prefix;
  inode<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  *inode;
  undefined1 auStack_70 [7];
  node_type node_type;
  art_key_type remaining_key;
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  *pdStack_58;
  tree_depth_type depth;
  node_ptr *node;
  leaf_reclaimable_ptr r;
  basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>
  *root_leaf;
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  *this_local;
  art_key_type k_local;
  
  k_local.field_0.key._M_ptr = (pointer)k.field_0._8_8_;
  this_local = k.field_0._0_8_;
  bVar1 = detail::basic_node_ptr<unodb::detail::node_header>::operator==(&this->root,(nullptr_t)0x0)
  ;
  if (bVar1) {
    k_local.field_0.key_bytes._M_elems[0xf] = 0;
  }
  else {
    nVar2 = detail::basic_node_ptr<unodb::detail::node_header>::type(&this->root);
    if (nVar2 == LEAF) {
      this_00 = detail::basic_node_ptr<unodb::detail::node_header>::
                ptr<unodb::detail::basic_leaf<std::span<std::byte_const,18446744073709551615ul>,unodb::detail::node_header>*>
                          (&this->root);
      r._M_t.
      super___uniq_ptr_impl<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
      .
      super__Head_base<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>_*,_false>
      ._M_head_impl =
           (basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>
            *)this_local;
      k_00.field_0.key._M_extent._M_extent_value =
           (__extent_storage<18446744073709551615UL>)
           (__extent_storage<18446744073709551615UL>)k_local.field_0.key._M_ptr;
      k_00.field_0.key._M_ptr = (pointer)this_local;
      bVar1 = detail::
              basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>
              ::matches(this_00,k_00);
      if (bVar1) {
        detail::
        basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>
        ::reclaim_leaf_on_scope_exit
                  ((basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>
                    *)&node,this_00,this);
        detail::basic_node_ptr<unodb::detail::node_header>::operator=(&this->root,(nullptr_t)0x0);
        k_local.field_0.key_bytes._M_elems[0xf] = 1;
        std::
        unique_ptr<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
        ::~unique_ptr((unique_ptr<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                       *)&node);
      }
      else {
        k_local.field_0.key_bytes._M_elems[0xf] = 0;
      }
    }
    else {
      pdStack_58 = this;
      detail::
      tree_depth<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>_>
      ::tree_depth((tree_depth<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>_>
                    *)((long)&remaining_key.field_0.key._M_extent._M_extent_value + 4),0);
      _auStack_70 = this_local;
      remaining_key.field_0.key._M_ptr = k_local.field_0.key._M_ptr;
      while( true ) {
        nVar2 = detail::basic_node_ptr<unodb::detail::node_header>::type(&pdStack_58->root);
        if (nVar2 == LEAF) {
          __assert_fail("node_type != node_type::LEAF",
                        "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art.hpp"
                        ,0x3f9,
                        "bool unodb::db<std::span<const std::byte>, std::span<const std::byte>>::remove_internal(art_key_type) [Key = std::span<const std::byte>, Value = std::span<const std::byte>]"
                       );
        }
        this_01 = &detail::basic_node_ptr<unodb::detail::node_header>::
                   ptr<unodb::detail::inode<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>*>
                             (&pdStack_58->root)->
                   super_inode_base<std::span<const_std::byte>,_std::span<const_std::byte>_>;
        this_02 = detail::
                  basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                  ::get_key_prefix(this_01);
        bVar3 = detail::
                key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
                ::length((key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
                          *)&this_02->f);
        remove_result.
        super__Optional_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true,_true>
        ._M_payload.
        super__Optional_payload_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>.
        _8_8_ = _auStack_70;
        shifted_key.field_0.key._M_extent._M_extent_value =
             (__extent_storage<18446744073709551615UL>)
             (__extent_storage<18446744073709551615UL>)remaining_key.field_0.key._M_ptr;
        shifted_key.field_0.key._M_ptr = (pointer)_auStack_70;
        uVar4 = detail::
                key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
                ::get_shared_length((key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
                                     *)&this_02->f,shifted_key);
        if (uVar4 < bVar3) break;
        if (uVar4 != bVar3) {
          __assert_fail("shared_prefix_len == key_prefix_length",
                        "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art.hpp"
                        ,0x401,
                        "bool unodb::db<std::span<const std::byte>, std::span<const std::byte>>::remove_internal(art_key_type) [Key = std::span<const std::byte>, Value = std::span<const std::byte>]"
                       );
        }
        detail::
        tree_depth<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>_>
        ::operator+=((tree_depth<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>_>
                      *)((long)&remaining_key.field_0.key._M_extent._M_extent_value + 4),(uint)bVar3
                    );
        detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>::shift_right
                  ((basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> *)auStack_70,
                   (ulong)bVar3);
        child_ptr._7_1_ =
             detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>::operator[]
                       ((basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> *)
                        auStack_70,0);
        oVar6 = detail::
                basic_inode_impl<unodb::detail::basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::db,unodb::in_fake_critical_section,unodb::fake_lock,unodb::fake_read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::node_header>,unodb::detail::inode_defs,unodb::detail::db_inode_deleter,unodb::detail::basic_db_leaf_deleter>>
                ::
                remove_or_choose_subtree<std::optional<unodb::detail::basic_node_ptr<unodb::detail::node_header>*>,std::byte,unodb::detail::basic_art_key<std::span<std::byte_const,18446744073709551615ul>>&,unodb::db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>&,unodb::detail::basic_node_ptr<unodb::detail::node_header>*&>
                          ((basic_inode_impl<unodb::detail::basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::db,unodb::in_fake_critical_section,unodb::fake_lock,unodb::fake_read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::node_header>,unodb::detail::inode_defs,unodb::detail::db_inode_deleter,unodb::detail::basic_db_leaf_deleter>>
                            *)this_01,nVar2,(byte *)((long)&child_ptr + 7),
                           (basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> *)
                           &this_local,this,
                           (basic_node_ptr<unodb::detail::node_header> **)&stack0xffffffffffffffa8);
        local_b0 = oVar6.
                   super__Optional_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true,_true>
                   ._M_payload.
                   super__Optional_payload_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>
                   ._M_payload;
        remove_result.
        super__Optional_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true,_true>
        ._M_payload.
        super__Optional_payload_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>.
        _M_payload._0_1_ =
             oVar6.
             super__Optional_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true,_true>
             ._M_payload.
             super__Optional_payload_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>
             ._M_engaged;
        bVar1 = std::optional::operator_cast_to_bool((optional *)&local_b0);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          k_local.field_0.key_bytes._M_elems[0xf] = 0;
          goto LAB_0023e24b;
        }
        ppbVar5 = std::optional<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>::
                  operator*((optional<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*> *
                            )&local_b0);
        pdStack_58 = (db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                      *)*ppbVar5;
        if (pdStack_58 ==
            (db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
             *)0x0) {
          k_local.field_0.key_bytes._M_elems[0xf] = 1;
          goto LAB_0023e24b;
        }
        detail::
        tree_depth<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>_>
        ::operator++((tree_depth<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>_>
                      *)((long)&remaining_key.field_0.key._M_extent._M_extent_value + 4));
        detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>::shift_right
                  ((basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> *)auStack_70,
                   1);
      }
      k_local.field_0.key_bytes._M_elems[0xf] = 0;
    }
  }
LAB_0023e24b:
  return (bool)(k_local.field_0.key_bytes._M_elems[0xf] & 1);
}

Assistant:

bool db<Key, Value>::remove_internal(art_key_type k) {
  if (UNODB_DETAIL_UNLIKELY(root == nullptr)) return false;

  if (root.type() == node_type::LEAF) {
    auto* const root_leaf{root.ptr<leaf_type*>()};
    if (root_leaf->matches(k)) {
      const auto r{art_policy::reclaim_leaf_on_scope_exit(root_leaf, *this)};
      root = nullptr;
      return true;
    }
    return false;
  }

  auto* node = &root;
  tree_depth_type depth{};
  auto remaining_key{k};

  while (true) {
    const auto node_type = node->type();
    UNODB_DETAIL_ASSERT(node_type != node_type::LEAF);

    auto* const inode{node->template ptr<inode_type*>()};
    const auto& key_prefix{inode->get_key_prefix()};
    const auto key_prefix_length{key_prefix.length()};
    const auto shared_prefix_len{key_prefix.get_shared_length(remaining_key)};
    if (shared_prefix_len < key_prefix_length) return false;

    UNODB_DETAIL_ASSERT(shared_prefix_len == key_prefix_length);
    depth += key_prefix_length;
    remaining_key.shift_right(key_prefix_length);

    const auto remove_result{inode->template remove_or_choose_subtree<
        std::optional<detail::node_ptr*>>(node_type, remaining_key[0], k, *this,
                                          node)};
    if (UNODB_DETAIL_UNLIKELY(!remove_result)) return false;

    auto* const child_ptr{*remove_result};
    if (child_ptr == nullptr) return true;

    node = child_ptr;
    ++depth;
    remaining_key.shift_right(1);
  }
}